

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O3

void deqp::gles3::Functional::DepthStencilCaseUtil::translateCommand
               (RenderCommand *src,RefRenderCommand *dst,TestRenderTarget *renderTarget)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  TestFunc TVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  
  iVar2 = renderTarget->depthBits;
  iVar3 = renderTarget->stencilBits;
  if ((src->params).visibleFace == FACETYPE_FRONT) {
    *(undefined8 *)(dst->quad).posA.m_data = *(undefined8 *)&src->rect;
    iVar7 = (src->rect).left + (src->rect).width + -1;
  }
  else {
    *(ulong *)(dst->quad).posA.m_data =
         CONCAT44((src->rect).bottom,(src->rect).width + (src->rect).left + -1);
    iVar7 = (src->rect).left;
  }
  *(ulong *)(dst->quad).posB.m_data = CONCAT44((src->rect).bottom + (src->rect).height + -1,iVar7);
  lVar9 = 0;
  do {
    uVar4 = *(undefined8 *)((src->color).m_data + 2);
    puVar1 = (undefined8 *)((long)(dst->quad).color[0].m_data + lVar9);
    *puVar1 = *(undefined8 *)(src->color).m_data;
    puVar1[1] = uVar4;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  fVar10 = (src->params).depth * 0.5 + 0.5;
  (dst->quad).depth[0] = fVar10;
  (dst->quad).depth[1] = fVar10;
  (dst->quad).depth[2] = fVar10;
  (dst->quad).depth[3] = fVar10;
  *(undefined4 *)(dst->state).colorMask.m_data = *(undefined4 *)(src->colorMask).m_data;
  (dst->state).scissorTestEnabled = false;
  uVar8 = 0;
  if (0 < iVar3) {
    uVar8 = *(uint *)&(src->params).stencilTestEnabled;
  }
  (dst->state).stencilTestEnabled = SUB41(uVar8,0);
  uVar6 = 0;
  if (0 < iVar2) {
    uVar6 = *(uint *)&(src->params).depthTestEnabled;
  }
  (dst->state).depthTestEnabled = SUB41(uVar6,0);
  (dst->state).blendMode = BLENDMODE_NONE;
  (dst->state).numStencilBits = renderTarget->stencilBits;
  if ((uVar6 & 1) != 0) {
    TVar5 = sglr::rr_util::mapGLTestFunc((src->params).depthFunc);
    (dst->state).depthFunc = TVar5;
    (dst->state).depthMask = (src->params).depthWriteMask;
    uVar8 = (uint)(dst->state).stencilTestEnabled;
  }
  if ((uVar8 & 1) != 0) {
    translateStencilState((src->params).stencil + 1,(dst->state).stencilStates + 1);
    translateStencilState((src->params).stencil,(dst->state).stencilStates);
    return;
  }
  return;
}

Assistant:

void translateCommand (const RenderCommand& src, RefRenderCommand& dst, const TestRenderTarget& renderTarget)
{
	const float		far				= 1.0f;
	const float		near			= 0.0f;
	bool			hasDepth		= renderTarget.depthBits > 0;
	bool			hasStencil		= renderTarget.stencilBits > 0;
	bool			isFrontFacing	= src.params.visibleFace == rr::FACETYPE_FRONT;

	dst.quad.posA = IVec2(isFrontFacing ? src.rect.left : (src.rect.left+src.rect.width-1), src.rect.bottom);
	dst.quad.posB = IVec2(isFrontFacing ? (src.rect.left+src.rect.width-1) : src.rect.left, src.rect.bottom+src.rect.height-1);

	std::fill(DE_ARRAY_BEGIN(dst.quad.color), DE_ARRAY_END(dst.quad.color), src.color);
	std::fill(DE_ARRAY_BEGIN(dst.quad.depth), DE_ARRAY_END(dst.quad.depth), ((far-near)/2.0f) * src.params.depth + (near+far)/2.0f);

	dst.state.colorMask = src.colorMask;

	dst.state.scissorTestEnabled		= false;
	dst.state.stencilTestEnabled		= hasStencil && src.params.stencilTestEnabled;
	dst.state.depthTestEnabled			= hasDepth && src.params.depthTestEnabled;
	dst.state.blendMode					= rr::BLENDMODE_NONE;
	dst.state.numStencilBits			= renderTarget.stencilBits;

	if (dst.state.depthTestEnabled)
	{
		dst.state.depthFunc					= sglr::rr_util::mapGLTestFunc(src.params.depthFunc);
		dst.state.depthMask					= src.params.depthWriteMask;
	}

	if (dst.state.stencilTestEnabled)
	{
		translateStencilState(src.params.stencil[rr::FACETYPE_BACK],	dst.state.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.params.stencil[rr::FACETYPE_FRONT],	dst.state.stencilStates[rr::FACETYPE_FRONT]);
	}
}